

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
boost::random::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<_14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<_5>,_boost::random::detail::no_tempering>
          *gen)

{
  char cVar1;
  ostream *poVar2;
  size_t i;
  size_t index;
  char local_29;
  
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  index = 0;
  do {
    well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<-14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<-5>,_boost::random::detail::no_tempering>
    ::compute(gen,index);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    local_29 = cVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
    index = index + 1;
  } while (index != 0x13);
  return out;
}

Assistant:

std::basic_ostream<E, T>&
        operator<<(std::basic_ostream<E, T>& out, const well_engine& gen)
    {
        const E space = out.widen(' ');

        for (std::size_t i = 0; i != state_size; ++i)
            out << gen.compute(i) << space;

        return out;
    }